

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O2

int __thiscall MixerContext::init(MixerContext *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int maxsum;
  int iVar6;
  int32_t (*paiVar7) [32];
  uint32_t j;
  ulong uVar8;
  uint32_t j_1;
  double (*padVar9) [32];
  long lVar10;
  uint32_t i;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  iVar1 = auto_matrix(this);
  if (iVar1 == 0) {
    if (this->_format == CUBEB_SAMPLE_S16LE) {
      padVar9 = this->_matrix;
      iVar1 = 0;
      for (uVar11 = 0; uVar11 < this->_out_ch_count; uVar11 = uVar11 + 1) {
        dVar12 = 0.0;
        iVar6 = 0;
        for (uVar8 = 0; uVar8 < this->_in_ch_count; uVar8 = uVar8 + 1) {
          dVar13 = (*padVar9)[uVar8] * 32768.0 + dVar12;
          lVar3 = lrintf((float)dVar13);
          iVar2 = (int)lVar3;
          dVar12 = dVar12 + (dVar13 - (double)iVar2);
          iVar5 = -iVar2;
          if (0 < iVar2) {
            iVar5 = iVar2;
          }
          iVar6 = iVar6 + iVar5;
        }
        if (iVar1 <= iVar6) {
          iVar1 = iVar6;
        }
        padVar9 = padVar9 + 1;
      }
      if (0x8000 < iVar1) {
        this->_clipping = true;
      }
    }
    padVar9 = this->_matrix;
    paiVar7 = this->_matrix32;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      iVar1 = 0;
      for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
        lVar4 = lrintf((float)((*padVar9)[lVar10] * 32768.0));
        (*paiVar7)[lVar10] = (int32_t)lVar4;
        if (((*padVar9)[lVar10] != 0.0) || (NAN((*padVar9)[lVar10]))) {
          lVar4 = (long)iVar1;
          iVar1 = iVar1 + 1;
          this->_matrix_ch[lVar3][lVar4 + 1] = (uint8_t)lVar10;
        }
      }
      this->_matrix_ch[lVar3][0] = (uint8_t)iVar1;
      padVar9 = padVar9 + 1;
      paiVar7 = paiVar7 + 1;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int MixerContext::init()
{
  int r = auto_matrix();
  if (r) {
    return r;
  }

  // Determine if matrix operation would overflow
  if (_format == CUBEB_SAMPLE_S16NE) {
    int maxsum = 0;
    for (uint32_t i = 0; i < _out_ch_count; i++) {
      double rem = 0;
      int sum = 0;

      for (uint32_t j = 0; j < _in_ch_count; j++) {
        double target = _matrix[i][j] * 32768 + rem;
        int value = lrintf(target);
        rem += target - value;
        sum += std::abs(value);
      }
      maxsum = std::max(maxsum, sum);
    }
    if (maxsum > 32768) {
      _clipping = true;
    }
  }

  // FIXME quantize for integers
  for (uint32_t i = 0; i < CHANNELS_MAX; i++) {
    int ch_in = 0;
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      _matrix32[i][j] = lrintf(_matrix[i][j] * 32768);
      if (_matrix[i][j]) {
        _matrix_ch[i][++ch_in] = j;
      }
    }
    _matrix_ch[i][0] = ch_in;
  }

  return 0;
}